

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

value_type * __thiscall
toml::
result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::unwrap(result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this)

{
  runtime_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->is_ok_ != false) {
    return (value_type *)&this->field_1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (&sStack_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->field_1).succ);
  std::operator+(&local_38,"toml::result: bad unwrap: ",&sStack_58);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_type const& unwrap() const&
    {
        if(is_err())
        {
            throw std::runtime_error("toml::result: bad unwrap: " +
                                     format_error(this->as_err()));
        }
        return this->succ.value;
    }